

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O2

void __thiscall
flatbuffers::java::JavaGenerator::GenVectorAccessObject
          (JavaGenerator *this,StructDef *struct_def,string *code)

{
  bool bVar1;
  FieldDef *pFVar2;
  Value *pVVar3;
  pointer ppFVar4;
  char *__rhs;
  string index;
  string type_name;
  string method_indent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> method_start;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::string::append((char *)code);
  std::__cxx11::string::append((char *)code);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"private",(allocator<char> *)&local_a8);
  pVVar3 = SymbolTable<flatbuffers::Value>::Lookup
                     (&(struct_def->super_Definition).attributes,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  if (pVVar3 == (Value *)0x0) {
    std::__cxx11::string::append((char *)code);
  }
  std::__cxx11::string::append((char *)code);
  std::__cxx11::string::append((char *)code);
  std::__cxx11::string::append((char *)code);
  std::__cxx11::string::append((char *)code);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"    ",(allocator<char> *)&local_a8);
  std::operator+(&local_a8,&local_88,"public Vector ");
  std::__cxx11::string::append((string *)code);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::append((char *)code);
  std::__cxx11::string::append((char *)code);
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_a8,&this->namer_,struct_def);
  std::operator+(&bStack_108,&local_88,"public ");
  std::operator+(&local_e8,&bStack_108,&local_a8);
  std::operator+(&local_48,&local_e8," get");
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&bStack_108);
  std::operator+(&local_e8,&local_48,"(int j) { return get");
  std::__cxx11::string::append((string *)code);
  std::__cxx11::string::~string((string *)&local_e8);
  std::operator+(&bStack_108,"(new ",&local_a8);
  std::operator+(&local_e8,&bStack_108,"(), j); }\n");
  std::__cxx11::string::append((string *)code);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&bStack_108);
  std::operator+(&local_68,&local_48,"(");
  std::operator+(&bStack_108,&local_68,&local_a8);
  std::operator+(&local_e8,&bStack_108," obj, int j) { ");
  std::__cxx11::string::append((string *)code);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&bStack_108);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::append((char *)code);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"__element(j)",(allocator<char> *)&bStack_108);
  bVar1 = struct_def->fixed;
  if (bVar1 == true) {
    std::__cxx11::string::string((string *)&bStack_108,(string *)&local_e8);
  }
  else {
    std::operator+(&local_68,"__indirect(",&local_e8);
    std::operator+(&bStack_108,&local_68,", bb)");
  }
  std::__cxx11::string::append((string *)code);
  std::__cxx11::string::~string((string *)&bStack_108);
  if (bVar1 == false) {
    std::__cxx11::string::~string((string *)&local_68);
  }
  std::__cxx11::string::append((char *)code);
  if (struct_def->fixed == false) {
    ppFVar4 = (struct_def->fields).vec.
              super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      if (ppFVar4 ==
          (struct_def->fields).vec.
          super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) goto LAB_001ba67a;
      pFVar2 = *ppFVar4;
      ppFVar4 = ppFVar4 + 1;
    } while (pFVar2->key != true);
    __rhs = "";
    if ((((this->super_BaseGenerator).parser_)->opts).gen_nullable != false) {
      __rhs = "@Nullable ";
    }
    std::operator+(&bStack_108,&local_88,__rhs);
    std::__cxx11::string::append((string *)code);
    std::__cxx11::string::~string((string *)&bStack_108);
    std::operator+(&local_c8,"public ",&local_a8);
    std::operator+(&bStack_108,&local_c8," ");
    std::__cxx11::string::append((string *)code);
    std::__cxx11::string::~string((string *)&bStack_108);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::append((char *)code);
    pVVar3 = &pFVar2->value;
    GenTypeNameDest_abi_cxx11_(&local_c8,this,&pVVar3->type);
    std::operator+(&bStack_108,&local_c8," key) { ");
    std::__cxx11::string::append((string *)code);
    std::__cxx11::string::~string((string *)&bStack_108);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::append((char *)code);
    std::__cxx11::string::append((char *)code);
    std::__cxx11::string::append((char *)code);
    std::__cxx11::string::append((char *)code);
    std::operator+(&bStack_108,&local_88,__rhs);
    std::__cxx11::string::append((string *)code);
    std::__cxx11::string::~string((string *)&bStack_108);
    std::operator+(&local_c8,"public ",&local_a8);
    std::operator+(&bStack_108,&local_c8," ");
    std::__cxx11::string::append((string *)code);
    std::__cxx11::string::~string((string *)&bStack_108);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::append((char *)code);
    std::operator+(&bStack_108,&local_a8," obj, ");
    std::__cxx11::string::append((string *)code);
    std::__cxx11::string::~string((string *)&bStack_108);
    GenTypeNameDest_abi_cxx11_(&local_c8,this,&pVVar3->type);
    std::operator+(&bStack_108,&local_c8," key) { ");
    std::__cxx11::string::append((string *)code);
    std::__cxx11::string::~string((string *)&bStack_108);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::append((char *)code);
    std::__cxx11::string::append((char *)code);
    std::__cxx11::string::append((char *)code);
    std::__cxx11::string::append((char *)code);
  }
LAB_001ba67a:
  std::__cxx11::string::append((char *)code);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

void GenVectorAccessObject(StructDef &struct_def, std::string &code) const {
    // Generate a vector of structs accessor class.
    code += "\n";
    code += "  ";
    if (!struct_def.attributes.Lookup("private")) code += "public ";
    code += "static ";
    code += "final ";
    code += "class Vector extends ";
    code += "BaseVector {\n";

    // Generate the __assign method that sets the field in a pre-existing
    // accessor object. This is to allow object reuse.
    std::string method_indent = "    ";
    code += method_indent + "public Vector ";
    code += "__assign(int _vector, int _element_size, ByteBuffer _bb) { ";
    code += "__reset(_vector, _element_size, _bb); return this; }\n\n";

    auto type_name = namer_.Type(struct_def);
    auto method_start = method_indent + "public " + type_name + " get";
    // Generate the accessors that don't do object reuse.
    code += method_start + "(int j) { return get";
    code += "(new " + type_name + "(), j); }\n";
    code += method_start + "(" + type_name + " obj, int j) { ";
    code += " return obj.__assign(";
    std::string index = "__element(j)";
    code += struct_def.fixed ? index : "__indirect(" + index + ", bb)";
    code += ", bb); }\n";
    // See if we should generate a by-key accessor.
    if (!struct_def.fixed) {
      auto &fields = struct_def.fields.vec;
      for (auto kit = fields.begin(); kit != fields.end(); ++kit) {
        auto &key_field = **kit;
        if (key_field.key) {
          auto nullable_annotation =
              parser_.opts.gen_nullable ? "@Nullable " : "";
          code += method_indent + nullable_annotation;
          code += "public " + type_name + " ";
          code += "getByKey(";
          code += GenTypeNameDest(key_field.value.type) + " key) { ";
          code += " return __lookup_by_key(null, ";
          code += "__vector(), key, ";
          code += "bb); ";
          code += "}\n";
          code += method_indent + nullable_annotation;
          code += "public " + type_name + " ";
          code += "getByKey(";
          code += type_name + " obj, ";
          code += GenTypeNameDest(key_field.value.type) + " key) { ";
          code += " return __lookup_by_key(obj, ";
          code += "__vector(), key, ";
          code += "bb); ";
          code += "}\n";
          break;
        }
      }
    }
    code += "  }\n";
  }